

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_undo.c
# Opt level: O0

_undo_action * canvas_undo_init(_glist *x)

{
  int iVar1;
  _undo *p_Var2;
  _undo *udo;
  _undo_action *a;
  _glist *x_local;
  
  p_Var2 = canvas_undo_get(x);
  if (p_Var2 == (_undo *)0x0) {
    x_local = (_glist *)0x0;
  }
  else {
    x_local = (_glist *)getbytes(0x30);
    *(t_undo_type *)&(x_local->gl_obj).te_g.g_next = UNDO_INIT;
    (x_local->gl_obj).te_g.g_pd = (t_pd)x;
    *(_undo_action **)&(x_local->gl_obj).te_xpix = (_undo_action *)0x0;
    if (p_Var2->u_queue == (_undo_action *)0x0) {
      p_Var2->u_queue = (_undo_action *)x_local;
      p_Var2->u_last = (_undo_action *)x_local;
      canvas_undo_cleardirty(x);
      iVar1 = canvas_isabstraction(x);
      if (iVar1 == 0) {
        p_Var2->u_cleanstate = &DAT_00000001;
      }
      (x_local->gl_obj).te_inlet = (_inlet *)0x0;
      (x_local->gl_obj).te_outlet = (_outlet *)0x20c30d;
      canvas_show_undomenu(x,"no","no");
    }
    else {
      if (p_Var2->u_last->next != (_undo_action *)0x0) {
        canvas_undo_rebranch(x);
      }
      p_Var2->u_last->next = (_undo_action *)x_local;
      (x_local->gl_obj).te_inlet = (_inlet *)p_Var2->u_last;
      p_Var2->u_last = (_undo_action *)x_local;
    }
  }
  return (_undo_action *)x_local;
}

Assistant:

t_undo_action *canvas_undo_init(t_canvas *x)
{
    t_undo_action *a = 0;
    t_undo *udo = canvas_undo_get(x);
    if (!udo) return 0;
    a = (t_undo_action *)getbytes(sizeof(*a));
    a->type = 0;
    a->x = x;
    a->next = NULL;

    if (!udo->u_queue)
    {
        DEBUG_UNDO(post("%s: first init", __FUNCTION__));
        //this is the first init
        udo->u_queue = a;
        udo->u_last = a;

        canvas_undo_cleardirty(x);
            /* invalidate clean-state for re-created subpatches
             * since we do not know whether the re-created subpatch
             * is clean or unclean (it's undo-queue got lost when
             * it was deleted), we assume the worst */
        if (!canvas_isabstraction(x))
            udo->u_cleanstate = (void*)1;

        a->prev = NULL;
        a->name = "no";
        canvas_show_undomenu(x, "no", "no");
    }
    else
    {
        DEBUG_UNDO(post("%s: re-init %p", __FUNCTION__, udo->u_last->next));
        if (udo->u_last->next)
        {
            //we need to rebranch first then add the new action
            canvas_undo_rebranch(x);
        }
        udo->u_last->next = a;
        a->prev = udo->u_last;
        udo->u_last = a;
    }
    return(a);
}